

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall snestistics::Range::format(Range *this,StringBuilder *s)

{
  int local_1c;
  int last;
  int k;
  StringBuilder *s_local;
  Range *this_local;
  
  if (this->N != 0) {
    if (this->N < 4) {
      for (local_1c = 0; local_1c < this->N + -1; local_1c = local_1c + 1) {
        StringBuilder::format(s,"%X, ",(ulong)(uint)(this->first + this->step * local_1c));
      }
      StringBuilder::format(s,"%X",(ulong)(uint)(this->first + this->step * (this->N + -1)));
    }
    else {
      StringBuilder::format
                (s,"<%X, %X, ..., %X>",(ulong)(uint)this->first,
                 (ulong)(uint)(this->first + this->step),
                 (ulong)(uint)(this->first + this->step * this->N));
    }
  }
  return;
}

Assistant:

void format(StringBuilder &s) {
		if (N==0) {
		} else if (N<4) {
			for (int k=0; k<N-1; k++) {
				s.format("%X, ", first+step*k);
			}
			s.format("%X", first+step*(N-1));
		} else {
			int last = first + step * N;
			s.format("<%X, %X, ..., %X>", first, first + step, last);
		}
	}